

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<pstore::exchange::import_ns::callbacks>::
do_integer_digit_state
          (number_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  ulong uVar1;
  bool bVar2;
  error_category *peVar3;
  error_code err;
  
  if ((this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ != 4) {
    assert_failed("this->get_state () == integer_digit_state",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2d6);
  }
  if ((this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd == '\0') {
    assert_failed("is_integer_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2d7);
  }
  if (c == '.') {
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 6;
  }
  else {
    if ((c & 0xdfU) != 0x45) {
      if (9 < (byte)(c - 0x30U)) {
        (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
        make_result(this,parser);
        return false;
      }
      uVar1 = (ulong)(byte)(c - 0x30U) + this->int_acc_ * 10;
      if (this->int_acc_ <= uVar1) {
        this->int_acc_ = uVar1;
        return true;
      }
      peVar3 = get_error_category();
      err._M_cat = peVar3;
      err._0_8_ = 6;
      bVar2 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err);
      if (bVar2) {
        (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
        return true;
      }
      return true;
    }
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 8;
  }
  (this->fp_acc_).whole_part =
       ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd = 0;
  return true;
}

Assistant:

bool number_matcher<Callbacks>::do_integer_digit_state (parser<Callbacks> & parser,
                                                                    char const c) {
                PSTORE_ASSERT (this->get_state () == integer_digit_state);
                PSTORE_ASSERT (is_integer_);

                bool match = true;
                if (c == '.') {
                    this->set_state (frac_initial_digit_state);
                    number_is_float ();
                } else if (c == 'e' || c == 'E') {
                    this->set_state (exponent_sign_state);
                    number_is_float ();
                } else if (c >= '0' && c <= '9') {
                    std::uint64_t const new_acc = int_acc_ * 10U + static_cast<unsigned> (c - '0');
                    if (new_acc < int_acc_) { // Did this overflow?
                        this->set_error (parser, error_code::number_out_of_range);
                    } else {
                        int_acc_ = new_acc;
                    }
                } else {
                    match = false;
                    this->complete (parser);
                }
                return match;
            }